

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerPointers.h
# Opt level: O3

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>::
IsReusablePropertyIndex
          (SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false> *this
          ,unsigned_short propertyIndex)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar1;
  undefined2 in_register_00000032;
  
  this_00 = (this->
            super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>).
            propertyMap.ptr;
  if (CONCAT22(in_register_00000032,propertyIndex) < this_00->count - this_00->freeCount) {
    pSVar1 = JsUtil::
             BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt(this_00,CONCAT22(in_register_00000032,propertyIndex));
    return pSVar1->propertyIndex == propertyIndex;
  }
  return false;
}

Assistant:

T * operator->() const { return ptr; }